

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

RegSlot __thiscall IRBuilder::InnerScopeIndexToRegSlot(IRBuilder *this,uint32 index)

{
  uint uVar1;
  RegSlot RVar2;
  RegSlot RVar3;
  JITTimeFunctionBody *pJVar4;
  
  pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  uVar1 = JITTimeFunctionBody::GetInnerScopeCount(pJVar4);
  if (index < uVar1) {
    pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    RVar2 = JITTimeFunctionBody::GetFirstInnerScopeReg(pJVar4);
    pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    RVar3 = JITTimeFunctionBody::GetLocalsCount(pJVar4);
    if (RVar2 + index < RVar3) {
      return RVar2 + index;
    }
  }
  Js::Throw::FatalInternalError(-0x7fffbffb);
}

Assistant:

Js::RegSlot
IRBuilder::InnerScopeIndexToRegSlot(uint32 index) const
{
    if (index >= m_func->GetJITFunctionBody()->GetInnerScopeCount())
    {
        Js::Throw::FatalInternalError();
    }
    Js::RegSlot reg = m_func->GetJITFunctionBody()->GetFirstInnerScopeReg() + index;
    if (reg >= m_func->GetJITFunctionBody()->GetLocalsCount())
    {
        Js::Throw::FatalInternalError();
    }
    return reg;
}